

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *t1,OPJ_UINT32 w,OPJ_UINT32 h)

{
  int iVar1;
  OPJ_BOOL OVar2;
  OPJ_INT32 *pOVar3;
  opj_flag_t *poVar4;
  opj_flag_t oVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (0x400 < w) {
    __assert_fail("w <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5a8,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (0x400 < h) {
    __assert_fail("h <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5a9,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  uVar6 = h * w;
  if (0x1000 < uVar6) {
    __assert_fail("w * h <= 4096",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5aa,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (t1->encoder == 0) {
    if (uVar6 <= t1->datasize) {
LAB_0012852f:
      if (t1->data != (OPJ_INT32 *)0x0) {
        memset(t1->data,0,(ulong)(uVar6 * 4));
      }
      goto LAB_00128549;
    }
    opj_aligned_free(t1->data);
    pOVar3 = (OPJ_INT32 *)opj_aligned_malloc((ulong)(uVar6 * 4));
    t1->data = pOVar3;
    if (pOVar3 != (OPJ_INT32 *)0x0) {
      t1->datasize = uVar6;
      goto LAB_0012852f;
    }
LAB_0012863e:
    OVar2 = 0;
  }
  else {
LAB_00128549:
    iVar1 = w + 2;
    uVar7 = h + 3 >> 2;
    uVar6 = (uVar7 + 2) * iVar1;
    if (t1->flagssize < uVar6) {
      opj_aligned_free(t1->flags);
      poVar4 = (opj_flag_t *)opj_aligned_malloc((ulong)(uVar6 * 4));
      t1->flags = poVar4;
      if (poVar4 == (opj_flag_t *)0x0) goto LAB_0012863e;
    }
    t1->flagssize = uVar6;
    lVar8 = 0;
    memset(t1->flags,0,(ulong)(uVar6 * 4));
    poVar4 = t1->flags;
    do {
      poVar4[lVar8] = 0x49200000;
      lVar8 = lVar8 + 1;
    } while (iVar1 != (int)lVar8);
    lVar8 = 0;
    do {
      poVar4[(ulong)((uVar7 + 1) * iVar1) + lVar8] = 0x49200000;
      lVar8 = lVar8 + 1;
    } while (w + 2 != (int)lVar8);
    uVar6 = h & 3;
    if (uVar6 != 0) {
      oVar5 = 0x49000000;
      if (uVar6 != 1) {
        oVar5 = (uVar6 == 2 | 8) << 0x1b;
      }
      lVar8 = 0;
      do {
        poVar4[(ulong)(uVar7 * iVar1) + lVar8] = oVar5;
        lVar8 = lVar8 + 1;
      } while (iVar1 != (int)lVar8);
    }
    t1->w = w;
    t1->h = h;
    OVar2 = 1;
  }
  return OVar2;
}

Assistant:

static OPJ_BOOL opj_t1_allocate_buffers(
    opj_t1_t *t1,
    OPJ_UINT32 w,
    OPJ_UINT32 h)
{
    OPJ_UINT32 flagssize;
    OPJ_UINT32 flags_stride;

    /* No risk of overflow. Prior checks ensure those assert are met */
    /* They are per the specification */
    assert(w <= 1024);
    assert(h <= 1024);
    assert(w * h <= 4096);

    /* encoder uses tile buffer, so no need to allocate */
    if (!t1->encoder) {
        OPJ_UINT32 datasize = w * h;

        if (datasize > t1->datasize) {
            opj_aligned_free(t1->data);
            t1->data = (OPJ_INT32*) opj_aligned_malloc(datasize * sizeof(OPJ_INT32));
            if (!t1->data) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
            t1->datasize = datasize;
        }
        /* memset first arg is declared to never be null by gcc */
        if (t1->data != NULL) {
            memset(t1->data, 0, datasize * sizeof(OPJ_INT32));
        }
    }

    flags_stride = w + 2U; /* can't be 0U */

    flagssize = (h + 3U) / 4U + 2U;

    flagssize *= flags_stride;
    {
        opj_flag_t* p;
        OPJ_UINT32 x;
        OPJ_UINT32 flags_height = (h + 3U) / 4U;

        if (flagssize > t1->flagssize) {

            opj_aligned_free(t1->flags);
            t1->flags = (opj_flag_t*) opj_aligned_malloc(flagssize * sizeof(
                            opj_flag_t));
            if (!t1->flags) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        t1->flagssize = flagssize;

        memset(t1->flags, 0, flagssize * sizeof(opj_flag_t));

        p = &t1->flags[0];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        p = &t1->flags[((flags_height + 1) * flags_stride)];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        if (h % 4) {
            OPJ_UINT32 v = 0;
            p = &t1->flags[((flags_height) * flags_stride)];
            if (h % 4 == 1) {
                v |= T1_PI_1 | T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 2) {
                v |= T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 3) {
                v |= T1_PI_3;
            }
            for (x = 0; x < flags_stride; ++x) {
                *p++ = v;
            }
        }
    }

    t1->w = w;
    t1->h = h;

    return OPJ_TRUE;
}